

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  double dVar4;
  FeHierarchicTria<double> *xpr;
  undefined8 uVar5;
  size_type sVar6;
  undefined8 *puVar7;
  variable_if_dynamic<long,__1> vVar8;
  Index extraout_RDX;
  ActualDstType actualDst;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  Matrix<double,_1,__1,_1,_1,__1> MVar13;
  Matrix<double,_1,__1,_1,_1,__1> boundary_function;
  Matrix<double,_1,__1,_1,_1,__1> boundary_face_dofs;
  Matrix<double,__1,__1,_0,__1,__1> basis_functions;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_148;
  FeHierarchicTria<double> *local_130;
  undefined1 local_128 [56];
  Product<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
  local_f0;
  Matrix<double,__1,__1,_0,__1,__1> local_80;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_68;
  
  iVar12 = *(int *)((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                           ).m_storage.m_cols + 4);
  iVar1 = *(int *)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_data;
  iVar2 = *(int *)((long)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_data + 4);
  sVar6 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals);
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  this->interior_degree_ = 0;
  (this->edge_degrees_)._M_elems[0] = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,(ulong)sVar6);
  local_130 = this;
  NodalValuesToVertexDofs((FeHierarchicTria<double> *)local_128,nodevals);
  Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)this,0,0,1,3);
  uVar5 = local_128._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Matrix<double,1,_1,1,1,_1>,double,double>
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)local_128,(assign_op<double,_double> *)&local_68);
  vVar8.m_value =
       local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
       m_value;
  if ((((ulong)local_f0.m_lhs.
               super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
               m_data & 7) == 0) &&
     (vVar8.m_value =
           (long)((uint)((ulong)local_f0.m_lhs.
                                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                                .m_data >> 3) & 1),
     local_f0.m_lhs.
     super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
     super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
     m_value <= vVar8.m_value)) {
    vVar8.m_value =
         local_f0.m_lhs.
         super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols
         .m_value;
  }
  lVar9 = local_f0.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value - vVar8.m_value;
  if (0 < vVar8.m_value) {
    uVar10 = 0;
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (vVar8.m_value != uVar10);
  }
  uVar10 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + vVar8.m_value;
  if (1 < lVar9) {
    do {
      p_Var3 = ((_func_int **)(uVar5 + vVar8.m_value * 8))[1];
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [vVar8.m_value] = (double)*(_func_int **)(uVar5 + vVar8.m_value * 8);
      (local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data +
      vVar8.m_value)[1] = (double)p_Var3;
      vVar8.m_value = vVar8.m_value + 2;
    } while (vVar8.m_value < (long)uVar10);
  }
  if ((long)uVar10 <
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value) {
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (local_f0.m_lhs.
             super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value != uVar10);
  }
  free((void *)local_128._0_8_);
  NodalValuesToEdgeDofs((FeHierarchicTria<double> *)local_128,nodevals);
  iVar12 = iVar1 + -1 + iVar12;
  Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)local_130,0,3,1,(ulong)(uint)(iVar2 + -2 + iVar12));
  uVar5 = local_128._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Matrix<double,1,_1,1,1,_1>,double,double>
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)local_128,(assign_op<double,_double> *)&local_68);
  vVar8.m_value =
       local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
       m_value;
  if ((((ulong)local_f0.m_lhs.
               super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
               m_data & 7) == 0) &&
     (vVar8.m_value =
           (long)((uint)((ulong)local_f0.m_lhs.
                                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                                .m_data >> 3) & 1),
     local_f0.m_lhs.
     super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
     super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
     m_value <= vVar8.m_value)) {
    vVar8.m_value =
         local_f0.m_lhs.
         super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols
         .m_value;
  }
  lVar9 = local_f0.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value - vVar8.m_value;
  if (0 < vVar8.m_value) {
    uVar10 = 0;
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (vVar8.m_value != uVar10);
  }
  uVar10 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + vVar8.m_value;
  if (1 < lVar9) {
    do {
      p_Var3 = ((_func_int **)(uVar5 + vVar8.m_value * 8))[1];
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [vVar8.m_value] = (double)*(_func_int **)(uVar5 + vVar8.m_value * 8);
      (local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data +
      vVar8.m_value)[1] = (double)p_Var3;
      vVar8.m_value = vVar8.m_value + 2;
    } while (vVar8.m_value < (long)uVar10);
  }
  if ((long)uVar10 <
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value) {
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (local_f0.m_lhs.
             super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value != uVar10);
  }
  free((void *)local_128._0_8_);
  NodalValuesToFaceDofs((FeHierarchicTria<double> *)local_128,nodevals);
  xpr = local_130;
  sVar6 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  uVar10 = (ulong)(uint)(iVar12 + iVar2 + 1);
  Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)xpr,0,uVar10,1,(ulong)sVar6);
  uVar5 = local_128._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Matrix<double,1,_1,1,1,_1>,double,double>
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)local_128,(assign_op<double,_double> *)&local_68);
  vVar8.m_value =
       local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
       m_value;
  if ((((ulong)local_f0.m_lhs.
               super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
               m_data & 7) == 0) &&
     (vVar8.m_value =
           (long)((uint)((ulong)local_f0.m_lhs.
                                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                                .m_data >> 3) & 1),
     local_f0.m_lhs.
     super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
     super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
     m_value <= vVar8.m_value)) {
    vVar8.m_value =
         local_f0.m_lhs.
         super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols
         .m_value;
  }
  lVar9 = local_f0.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value - vVar8.m_value;
  if (0 < vVar8.m_value) {
    uVar11 = 0;
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar11] = (double)*(_func_int **)(uVar5 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while (vVar8.m_value != uVar11);
  }
  uVar11 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + vVar8.m_value;
  if (1 < lVar9) {
    do {
      p_Var3 = ((_func_int **)(uVar5 + vVar8.m_value * 8))[1];
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [vVar8.m_value] = (double)*(_func_int **)(uVar5 + vVar8.m_value * 8);
      (local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data +
      vVar8.m_value)[1] = (double)p_Var3;
      vVar8.m_value = vVar8.m_value + 2;
    } while (vVar8.m_value < (long)uVar11);
  }
  if ((long)uVar11 <
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value) {
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar11] = (double)*(_func_int **)(uVar5 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while (local_f0.m_lhs.
             super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value != uVar11);
  }
  free((void *)local_128._0_8_);
  EvaluationNodes((MatrixXd *)(local_128 + 0x38),(FeHierarchicTria<double> *)nodevals);
  EvalReferenceShapeFunctions
            (&local_80,(FeHierarchicTria<double> *)nodevals,(MatrixXd *)(local_128 + 0x38));
  free(local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data);
  Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)local_128,
             (Matrix<double,_1,__1,_1,_1,__1> *)xpr,0,0,1,uVar10);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_68,&local_80,0,0,uVar10,
             local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
  Eigen::
  Product<Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>
  ::Product((Product<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             *)(local_128 + 0x38),(Lhs *)local_128,&local_68);
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_cols = 0;
  if ((local_f0.m_rhs.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
       .m_cols.m_value != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816(local_f0.m_rhs.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_cols.m_value),0) < 1)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &std::out_of_range::vtable;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            (&local_148,1,
             local_f0.m_rhs.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value);
  if (local_148.m_storage.m_cols !=
      local_f0.m_rhs.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
      m_cols.m_value) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&local_148,1,
               local_f0.m_rhs.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_cols.m_value);
  }
  Eigen::internal::
  generic_product_impl_base<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,1,_1,1,1,_1>>
            ((Matrix<double,_1,__1,_1,_1,__1> *)&local_148,
             (Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             &local_f0.m_rhs);
  NodalValuesToFaceDofs((FeHierarchicTria<double> *)local_128,nodevals);
  sVar6 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)xpr,0,uVar10,1,(ulong)sVar6);
  uVar5 = local_128._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::internal::sub_assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)(local_128 + 0x38),
             (Matrix<double,_1,__1,_1,_1,__1> *)local_128,(sub_assign_op<double,_double> *)&local_68
            );
  vVar8.m_value =
       local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
       m_value;
  if ((((ulong)local_f0.m_lhs.
               super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
               m_data & 7) == 0) &&
     (vVar8.m_value =
           (long)((uint)((ulong)local_f0.m_lhs.
                                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                                .m_data >> 3) & 1),
     local_f0.m_lhs.
     super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
     super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
     m_value <= vVar8.m_value)) {
    vVar8.m_value =
         local_f0.m_lhs.
         super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols
         .m_value;
  }
  lVar9 = local_f0.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value - vVar8.m_value;
  if (0 < vVar8.m_value) {
    uVar10 = 0;
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = local_f0.m_lhs.
                 super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                 .m_data[uVar10] - (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (vVar8.m_value != uVar10);
  }
  uVar10 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + vVar8.m_value;
  if (1 < lVar9) {
    do {
      p_Var3 = ((_func_int **)(uVar5 + vVar8.m_value * 8))[1];
      dVar4 = (local_f0.m_lhs.
               super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
               m_data + vVar8.m_value)[1];
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [vVar8.m_value] =
           local_f0.m_lhs.
           super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
           m_data[vVar8.m_value] - (double)*(_func_int **)(uVar5 + vVar8.m_value * 8);
      (local_f0.m_lhs.
       super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data +
      vVar8.m_value)[1] = dVar4 - (double)p_Var3;
      vVar8.m_value = vVar8.m_value + 2;
    } while (vVar8.m_value < (long)uVar10);
  }
  if ((long)uVar10 <
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value) {
    do {
      local_f0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.m_data
      [uVar10] = local_f0.m_lhs.
                 super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                 .m_data[uVar10] - (double)*(_func_int **)(uVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (local_f0.m_lhs.
             super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value != uVar10);
  }
  free((void *)local_128._0_8_);
  free(local_148.m_storage.m_data);
  free(local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  MVar13.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       extraout_RDX;
  MVar13.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)xpr;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar13.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    const auto d0 = edge_degrees_[0] - 1;
    const auto d1 = edge_degrees_[1] - 1;
    const auto d2 = edge_degrees_[2] - 1;

    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    // Compute the basis function coefficients of the vertex basis functions
    dofs.segment(0, 3) = NodalValuesToVertexDofs(nodevals);
    // Compute the basis function coefficients on the edges
    dofs.segment(3, d0 + d1 + d2) = NodalValuesToEdgeDofs(nodevals);
    // Compute the basis function coefficients for the face bubbles
    dofs.segment(3 + d0 + d1 + d2, NumRefShapeFunctions(0)) =
        NodalValuesToFaceDofs(nodevals);
    // We need to orthogonalize the face bubble dual basis w.r.t. the
    // dual basis on the vertices and edges
    const Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
        basis_functions = EvalReferenceShapeFunctions(EvaluationNodes());
    const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> boundary_function =
        dofs.segment(0, 3 + d0 + d1 + d2) *
        basis_functions.block(0, 0, 3 + d0 + d1 + d2, basis_functions.cols());
    const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> boundary_face_dofs =
        NodalValuesToFaceDofs(boundary_function);
    dofs.segment(3 + d0 + d1 + d2, NumRefShapeFunctions(0)) -=
        boundary_face_dofs;
    return dofs;
  }